

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

void * memset(void *__s,int __c,size_t __n)

{
  undefined8 local_38;
  size_t i;
  uchar c_;
  uchar *s_;
  size_t n_local;
  int c_local;
  void *s_local;
  
  for (local_38 = 0; local_38 < __n; local_38 = local_38 + 1) {
    *(char *)((long)__s + local_38) = (char)__c;
  }
  return __s;
}

Assistant:

void *memset(void *s, int c, size_t n) {
    unsigned char *s_ = s;
    const unsigned char c_ = (unsigned char)c;
    for (size_t i = 0; i < n; ++i) {
        s_[i] = c_;
    }
    return s;
}